

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::StdString::StringMatcherBase::StringMatcherBase
          (StringMatcherBase *this,string *operation,CasedString *comparator)

{
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).super_MatcherUntypedBase.m_cachedToString.field_2;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString._M_string_length = 0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase.m_cachedToString.field_2._M_local_buf[0] = '\0';
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_001fd090;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_001fd0b8;
  CasedString::CasedString(&this->m_comparator,comparator);
  std::__cxx11::string::string((string *)&this->m_operation,(string *)operation);
  return;
}

Assistant:

StringMatcherBase::StringMatcherBase( std::string const& operation, CasedString const& comparator )
        : m_comparator( comparator ),
          m_operation( operation ) {
        }